

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double bradford_variance(double a,double b,double c)

{
  double dVar1;
  double dVar2;
  double __x;
  __type _Var3;
  double variance;
  double c_local;
  double b_local;
  double a_local;
  
  dVar1 = log(c + 1.0);
  dVar2 = log(c + 1.0);
  __x = log(c + 1.0);
  _Var3 = std::pow<double,int>(__x,2);
  return ((b - a) * (b - a) * (c * (dVar1 - 2.0) + dVar2 * 2.0)) / (c * 2.0 * _Var3);
}

Assistant:

double bradford_variance ( double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    BRADFORD_VARIANCE returns the variance of the Bradford PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    A < B,
//    0.0 < C.
//
//    Output, double BRADFORD_VARIANCE, the variance of the PDF.
//
{
  double variance;

  variance = ( b - a ) * ( b - a ) *
    ( c * ( log ( c + 1.0 ) - 2.0 ) + 2.0 * log ( c + 1.0 ) )
    / ( 2.0 * c * pow ( ( log ( c + 1.0 ) ), 2 ) );

  return variance;
}